

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

DString * export_to_json(char *source,simple_token *tree,_Bool array_out)

{
  DString *out_00;
  stack *s_00;
  stack *s;
  DString *out;
  _Bool array_out_local;
  simple_token *tree_local;
  char *source_local;
  
  out_00 = d_string_new("");
  s_00 = stack_new(5);
  export_token_tree_to_json(out_00,tree,source,0,s_00,array_out);
  return out_00;
}

Assistant:

DString * export_to_json(const char * source, simple_token * tree, bool array_out) {
	DString * out = d_string_new("");
	stack * s = stack_new(5);

	export_token_tree_to_json(out, tree, source, 0, s, array_out);

	return out;
}